

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

CordzInfo * __thiscall
absl::lts_20250127::cord_internal::CordzInfo::Next(CordzInfo *this,CordzSnapshot *snapshot)

{
  bool bVar1;
  anon_class_1_0_00000001 local_2a;
  anon_class_1_0_00000001 local_29;
  __pointer_type local_28;
  CordzInfo *next;
  CordzHandle *local_18;
  CordzSnapshot *snapshot_local;
  CordzInfo *this_local;
  
  local_18 = (CordzHandle *)snapshot;
  snapshot_local = (CordzSnapshot *)this;
  bVar1 = CordzHandle::is_snapshot((CordzHandle *)snapshot);
  if (!bVar1) {
    Next::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&next + 7));
  }
  local_28 = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                       (&this->ci_next_,memory_order_acquire);
  bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect(local_18,&this->super_CordzHandle);
  if (!bVar1) {
    Next::anon_class_1_0_00000001::operator()(&local_29);
  }
  bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect(local_18,&local_28->super_CordzHandle);
  if (!bVar1) {
    Next::anon_class_1_0_00000001::operator()(&local_2a);
  }
  return local_28;
}

Assistant:

CordzInfo* CordzInfo::Next(const CordzSnapshot& snapshot) const {
  ABSL_ASSERT(snapshot.is_snapshot());

  // Similar to the 'Head()' function, we do not need a mutex here.
  CordzInfo* next = ci_next_.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(this));
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(next));
  return next;
}